

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character-generator.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  AbilityScores *this;
  CharacterClass *pCVar4;
  Character *pCVar5;
  int iVar6;
  string name;
  char local_8a;
  char local_89;
  Skills *local_88;
  long *local_78;
  long local_70;
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  Character *local_38;
  
  local_38 = (Character *)0x0;
  iVar1 = parse_args(argc,argv,&local_38);
  if (local_38 != (Character *)0x0) goto LAB_00102faf;
  if (RANDOM_FLAG == false) {
    RANDOM_FLAG = (bool)ORPG::Characters::request_is_random();
    if (RANDOM_FLAG != false) goto LAB_00102e0b;
    uVar3 = ORPG::Characters::request_race();
  }
  else {
    RANDOM_FLAG = true;
LAB_00102e0b:
    uVar3 = ORPG::Characters::select_race(-1);
  }
  if (RANDOM_FLAG == true) {
    this = (AbilityScores *)operator_new(0x38);
    ORPG::AbilityScores::AbilityScores(this,'\0');
  }
  else {
    this = (AbilityScores *)ORPG::Characters::request_scores();
  }
  if (RANDOM_FLAG == true) {
    uVar2 = ORPG::Characters::random_bg_id();
  }
  else {
    uVar2 = ORPG::Characters::request_background();
  }
  if (RANDOM_FLAG == true) {
    pCVar4 = (CharacterClass *)ORPG::Characters::select_character_class(-1);
  }
  else {
    pCVar4 = (CharacterClass *)ORPG::Characters::request_class();
  }
  if (RANDOM_FLAG == true) {
    local_88 = (Skills *)operator_new(0x38);
    ORPG::Skills::Skills(local_88);
  }
  else {
    local_88 = (Skills *)ORPG::Characters::request_skills();
  }
  local_8a = '\x01';
  local_89 = '\x01';
  if (RANDOM_FLAG == false) {
    local_89 = ORPG::Characters::request_hitpoints(pCVar4);
  }
  if ((RANDOM_FLAG & 1U) == 0) {
    local_8a = ORPG::Characters::request_equipment();
  }
  if ((RANDOM_FLAG & 1U) == 0) {
    ORPG::Characters::request_name_abi_cxx11_();
  }
  else {
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  }
  pCVar5 = (Character *)operator_new(0xc0);
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)local_58,local_78,local_70 + (long)local_78);
  ORPG::Character::Character(pCVar5,uVar3,this,pCVar4,uVar2,local_88,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  iVar6 = 1;
  if (local_8a != '\0') {
    iVar6 = iVar1;
  }
  if (local_89 != '\0') {
    iVar6 = iVar1;
  }
  iVar1 = iVar6;
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
LAB_00102faf:
  if (iVar1 == 0) {
    if (SHEET_FLAG == false) {
      ORPG::Character::to_string_abi_cxx11_();
    }
    else {
      ORPG::Character::to_ascii_sheet_abi_cxx11_();
    }
    printf("%s",local_78);
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
    Character* character = nullptr;
    
    int status = parse_args(argc, argv, character); // may exit

    if(character == nullptr) {
        /* begin creating the character here */
        RANDOM_FLAG = RANDOM_FLAG ? RANDOM_FLAG : request_is_random();

        auto race       = RANDOM_FLAG ? new_random_race() : request_race();
        //TODO(incomingstick): randomly generate ability scores, not an empty set
        auto scores     = RANDOM_FLAG ? new AbilityScores : request_scores();
        auto bg         = RANDOM_FLAG ? random_bg_id() : request_background();
        auto charClass  = RANDOM_FLAG ? new_random_character_class() : request_class();
        auto skills     = RANDOM_FLAG ? new Skills : request_skills();
        auto hp         = RANDOM_FLAG ? true : request_hitpoints(charClass);
        auto equipment  = RANDOM_FLAG ? true : request_equipment();
        auto name       = RANDOM_FLAG ? "" : request_name();

        /* IMPORTANT(incomingstick): If this is not a pointer, it will segfault during GC... idk why */
        character = new Character(race, scores, charClass, bg, skills, name);

        if(!hp && !equipment) {
            status = EXIT_FAILURE;
        }
    }

    if(status != EXIT_FAILURE) {
        SHEET_FLAG ? 
            printf("%s", character->to_ascii_sheet().c_str()) :
            printf("%s", character->to_string().c_str());
    }

    return status;
}